

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

Node * __thiscall llvm::yaml::Document::parseBlockNode(Document *this)

{
  size_t *psVar1;
  pointer pcVar2;
  char *pcVar3;
  Stream *pSVar4;
  char *pcVar5;
  undefined8 uVar6;
  size_t __src;
  Token *pTVar7;
  _func_int **__dest;
  unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *puVar8;
  Node *pNVar9;
  ulong uVar10;
  ptrdiff_t _Num;
  unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *puVar11;
  SMLoc Start;
  Token local_2a8;
  Token local_270;
  Token local_238;
  Token local_200;
  Token local_1c8;
  Token local_190;
  Token local_158;
  Child local_120;
  undefined1 auStack_118 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  Child CStack_e8;
  Token TagInfo;
  ulong uStack_a8;
  Token T;
  Child CStack_68;
  Token AnchorInfo;
  
  pTVar7 = Scanner::peekNext((Scanner *)
                             (this->stream->scanner)._M_t.
                             super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                             .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
  uStack_a8 = *(ulong *)pTVar7;
  T._0_8_ = (pTVar7->Range).Data;
  psVar1 = &T.Range.Length;
  T.Range.Data = (char *)(pTVar7->Range).Length;
  T.Range.Length = (size_t)&T.Value._M_string_length;
  pcVar2 = (pTVar7->Value)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)psVar1,pcVar2,pcVar2 + (pTVar7->Value)._M_string_length);
  CStack_68.twine = (Twine *)0x0;
  AnchorInfo.Kind = TK_Error;
  AnchorInfo._4_4_ = 0;
  AnchorInfo.Range.Data = (char *)0x0;
  AnchorInfo.Range.Length = (size_t)&AnchorInfo.Value._M_string_length;
  AnchorInfo.Value._M_dataplus._M_p = (pointer)0x0;
  AnchorInfo.Value._M_string_length._0_1_ = 0;
  CStack_e8.twine = (Twine *)((ulong)(uint)CStack_e8._4_4_ << 0x20);
  TagInfo.Kind = TK_Error;
  TagInfo._4_4_ = 0;
  TagInfo.Range.Data = (char *)0x0;
  TagInfo.Range.Length = (size_t)&TagInfo.Value._M_string_length;
  TagInfo.Value._M_dataplus._M_p = (pointer)0x0;
  TagInfo.Value._M_string_length._0_1_ = 0;
LAB_00dc0a11:
  switch(uStack_a8 & 0xffffffff) {
  case 0:
    goto switchD_00dc0a28_caseD_0;
  default:
    pNVar9 = (Node *)Node::operator_new(0x48,&this->NodeAllocator,0x10);
    if (pNVar9 != (Node *)0x0) {
      pSVar4 = this->stream;
      pNVar9->_vptr_Node = (_func_int **)&PTR_anchor_01099770;
      pNVar9->Doc = &pSVar4->CurrentDoc;
      (pNVar9->SourceRange).Start.Ptr = (char *)0x0;
      (pNVar9->SourceRange).End.Ptr = (char *)0x0;
      pNVar9->TypeID = 0;
      (pNVar9->Anchor).Data = (char *)0x0;
      (pNVar9->Anchor).Length = 0;
      (pNVar9->Tag).Data = (char *)0x0;
      (pNVar9->Tag).Length = 0;
      pTVar7 = Scanner::peekNext(*(Scanner **)
                                  ((pSVar4->CurrentDoc)._M_t.
                                   super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                   .super__Head_base<0UL,_llvm::yaml::Document_*,_false>.
                                  _M_head_impl)->stream);
      goto LAB_00dc137e;
    }
    goto switchD_00dc0a28_caseD_0;
  case 7:
    pNVar9 = (Node *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
    if (pNVar9 == (Node *)0x0) goto switchD_00dc0a28_caseD_0;
    pSVar4 = this->stream;
    pNVar9->_vptr_Node = (_func_int **)&PTR_anchor_01099770;
    pNVar9->Doc = &pSVar4->CurrentDoc;
    (pNVar9->SourceRange).Start.Ptr = (char *)0x0;
    (pNVar9->SourceRange).End.Ptr = (char *)0x0;
    pNVar9->TypeID = 5;
    (pNVar9->Anchor).Data =
         (char *)((ulong)(AnchorInfo.Range.Data != (char *)0x0) + AnchorInfo._0_8_);
    (pNVar9->Anchor).Length =
         (long)AnchorInfo.Range.Data - (ulong)(AnchorInfo.Range.Data != (char *)0x0);
    (pNVar9->Tag).Data = (char *)TagInfo._0_8_;
    (pNVar9->Tag).Length = (size_t)TagInfo.Range.Data;
    pTVar7 = Scanner::peekNext(*(Scanner **)
                                ((pSVar4->CurrentDoc)._M_t.
                                 super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                 .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)
                                ->stream);
    pcVar5 = (pTVar7->Range).Data;
    (pNVar9->SourceRange).Start.Ptr = pcVar5;
    (pNVar9->SourceRange).End.Ptr = pcVar5;
    pNVar9->_vptr_Node = (_func_int **)&PTR_anchor_01099830;
    *(undefined4 *)&pNVar9[1]._vptr_Node = 2;
    break;
  case 9:
    Scanner::getNext(&local_270,
                     (Scanner *)
                     (this->stream->scanner)._M_t.
                     super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                     .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270.Value._M_dataplus._M_p != &local_270.Value.field_2) {
      operator_delete(local_270.Value._M_dataplus._M_p,
                      local_270.Value.field_2._M_allocated_capacity + 1);
    }
    pNVar9 = (Node *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
    if (pNVar9 == (Node *)0x0) goto switchD_00dc0a28_caseD_0;
    pSVar4 = this->stream;
    pNVar9->_vptr_Node = (_func_int **)&PTR_anchor_01099770;
    pNVar9->Doc = &pSVar4->CurrentDoc;
    (pNVar9->SourceRange).Start.Ptr = (char *)0x0;
    (pNVar9->SourceRange).End.Ptr = (char *)0x0;
    pNVar9->TypeID = 5;
    (pNVar9->Anchor).Data =
         (char *)((ulong)(AnchorInfo.Range.Data != (char *)0x0) + AnchorInfo._0_8_);
    (pNVar9->Anchor).Length =
         (long)AnchorInfo.Range.Data - (ulong)(AnchorInfo.Range.Data != (char *)0x0);
    (pNVar9->Tag).Data = (char *)TagInfo._0_8_;
    (pNVar9->Tag).Length = (size_t)TagInfo.Range.Data;
    pTVar7 = Scanner::peekNext(*(Scanner **)
                                ((pSVar4->CurrentDoc)._M_t.
                                 super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                 .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)
                                ->stream);
    pcVar5 = (pTVar7->Range).Data;
    (pNVar9->SourceRange).Start.Ptr = pcVar5;
    (pNVar9->SourceRange).End.Ptr = pcVar5;
    pNVar9->_vptr_Node = (_func_int **)&PTR_anchor_01099830;
    *(undefined4 *)&pNVar9[1]._vptr_Node = 0;
    break;
  case 10:
    Scanner::getNext(&local_238,
                     (Scanner *)
                     (this->stream->scanner)._M_t.
                     super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                     .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.Value._M_dataplus._M_p != &local_238.Value.field_2) {
      operator_delete(local_238.Value._M_dataplus._M_p,
                      local_238.Value.field_2._M_allocated_capacity + 1);
    }
    pNVar9 = (Node *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
    if (pNVar9 != (Node *)0x0) {
      pSVar4 = this->stream;
      pNVar9->_vptr_Node = (_func_int **)&PTR_anchor_01099770;
      pNVar9->Doc = &pSVar4->CurrentDoc;
      (pNVar9->SourceRange).Start.Ptr = (char *)0x0;
      (pNVar9->SourceRange).End.Ptr = (char *)0x0;
      pNVar9->TypeID = 4;
      (pNVar9->Anchor).Data =
           (char *)((ulong)(AnchorInfo.Range.Data != (char *)0x0) + AnchorInfo._0_8_);
      (pNVar9->Anchor).Length =
           (long)AnchorInfo.Range.Data - (ulong)(AnchorInfo.Range.Data != (char *)0x0);
      (pNVar9->Tag).Data = (char *)TagInfo._0_8_;
      (pNVar9->Tag).Length = (size_t)TagInfo.Range.Data;
      pTVar7 = Scanner::peekNext(*(Scanner **)
                                  ((pSVar4->CurrentDoc)._M_t.
                                   super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                   .super__Head_base<0UL,_llvm::yaml::Document_*,_false>.
                                  _M_head_impl)->stream);
      pcVar5 = (pTVar7->Range).Data;
      (pNVar9->SourceRange).Start.Ptr = pcVar5;
      (pNVar9->SourceRange).End.Ptr = pcVar5;
      pNVar9->_vptr_Node = (_func_int **)&PTR_anchor_01099810;
      *(undefined4 *)&pNVar9[1]._vptr_Node = 0;
      goto LAB_00dc1161;
    }
    goto switchD_00dc0a28_caseD_0;
  case 0xb:
  case 0xd:
  case 0xf:
    if ((this->Root == (Node *)0x0) || ((this->Root->TypeID & 0xfffffffe) != 4)) {
      Twine::Twine((Twine *)&local_120,"Unexpected token");
      Scanner::setError((Scanner *)
                        (this->stream->scanner)._M_t.
                        super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                        .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>,(Twine *)&local_120,
                        (iterator)T._0_8_);
    }
    else {
      pNVar9 = (Node *)Node::operator_new(0x48,&this->NodeAllocator,0x10);
      if (pNVar9 != (Node *)0x0) {
        pSVar4 = this->stream;
        pNVar9->_vptr_Node = (_func_int **)&PTR_anchor_01099770;
        pNVar9->Doc = &pSVar4->CurrentDoc;
        (pNVar9->SourceRange).Start.Ptr = (char *)0x0;
        (pNVar9->SourceRange).End.Ptr = (char *)0x0;
        pNVar9->TypeID = 0;
        (pNVar9->Anchor).Data = (char *)0x0;
        (pNVar9->Anchor).Length = 0;
        (pNVar9->Tag).Data = (char *)0x0;
        (pNVar9->Tag).Length = 0;
        pTVar7 = Scanner::peekNext(*(Scanner **)
                                    ((pSVar4->CurrentDoc)._M_t.
                                     super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                     .super__Head_base<0UL,_llvm::yaml::Document_*,_false>.
                                    _M_head_impl)->stream);
LAB_00dc137e:
        pcVar5 = (pTVar7->Range).Data;
        (pNVar9->SourceRange).Start.Ptr = pcVar5;
        (pNVar9->SourceRange).End.Ptr = pcVar5;
        pNVar9->_vptr_Node = (_func_int **)&PTR_anchor_01099790;
        goto LAB_00dc13f6;
      }
    }
    goto switchD_00dc0a28_caseD_0;
  case 0xc:
    Scanner::getNext(&local_200,
                     (Scanner *)
                     (this->stream->scanner)._M_t.
                     super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                     .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200.Value._M_dataplus._M_p != &local_200.Value.field_2) {
      operator_delete(local_200.Value._M_dataplus._M_p,
                      local_200.Value.field_2._M_allocated_capacity + 1);
    }
    pNVar9 = (Node *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
    if (pNVar9 == (Node *)0x0) goto switchD_00dc0a28_caseD_0;
    pSVar4 = this->stream;
    pNVar9->_vptr_Node = (_func_int **)&PTR_anchor_01099770;
    pNVar9->Doc = &pSVar4->CurrentDoc;
    (pNVar9->SourceRange).Start.Ptr = (char *)0x0;
    (pNVar9->SourceRange).End.Ptr = (char *)0x0;
    pNVar9->TypeID = 5;
    (pNVar9->Anchor).Data =
         (char *)((ulong)(AnchorInfo.Range.Data != (char *)0x0) + AnchorInfo._0_8_);
    (pNVar9->Anchor).Length =
         (long)AnchorInfo.Range.Data - (ulong)(AnchorInfo.Range.Data != (char *)0x0);
    (pNVar9->Tag).Data = (char *)TagInfo._0_8_;
    (pNVar9->Tag).Length = (size_t)TagInfo.Range.Data;
    pTVar7 = Scanner::peekNext(*(Scanner **)
                                ((pSVar4->CurrentDoc)._M_t.
                                 super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                 .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)
                                ->stream);
    pcVar5 = (pTVar7->Range).Data;
    (pNVar9->SourceRange).Start.Ptr = pcVar5;
    (pNVar9->SourceRange).End.Ptr = pcVar5;
    pNVar9->_vptr_Node = (_func_int **)&PTR_anchor_01099830;
    *(undefined4 *)&pNVar9[1]._vptr_Node = 1;
    break;
  case 0xe:
    Scanner::getNext(&local_1c8,
                     (Scanner *)
                     (this->stream->scanner)._M_t.
                     super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                     .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8.Value._M_dataplus._M_p != &local_1c8.Value.field_2) {
      operator_delete(local_1c8.Value._M_dataplus._M_p,
                      local_1c8.Value.field_2._M_allocated_capacity + 1);
    }
    pNVar9 = (Node *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
    if (pNVar9 != (Node *)0x0) {
      pSVar4 = this->stream;
      pNVar9->_vptr_Node = (_func_int **)&PTR_anchor_01099770;
      pNVar9->Doc = &pSVar4->CurrentDoc;
      (pNVar9->SourceRange).Start.Ptr = (char *)0x0;
      (pNVar9->SourceRange).End.Ptr = (char *)0x0;
      pNVar9->TypeID = 4;
      (pNVar9->Anchor).Data =
           (char *)((ulong)(AnchorInfo.Range.Data != (char *)0x0) + AnchorInfo._0_8_);
      (pNVar9->Anchor).Length =
           (long)AnchorInfo.Range.Data - (ulong)(AnchorInfo.Range.Data != (char *)0x0);
      (pNVar9->Tag).Data = (char *)TagInfo._0_8_;
      (pNVar9->Tag).Length = (size_t)TagInfo.Range.Data;
      pTVar7 = Scanner::peekNext(*(Scanner **)
                                  ((pSVar4->CurrentDoc)._M_t.
                                   super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                   .super__Head_base<0UL,_llvm::yaml::Document_*,_false>.
                                  _M_head_impl)->stream);
      pcVar5 = (pTVar7->Range).Data;
      (pNVar9->SourceRange).Start.Ptr = pcVar5;
      (pNVar9->SourceRange).End.Ptr = pcVar5;
      pNVar9->_vptr_Node = (_func_int **)&PTR_anchor_01099810;
      *(undefined4 *)&pNVar9[1]._vptr_Node = 1;
      goto LAB_00dc1161;
    }
    goto switchD_00dc0a28_caseD_0;
  case 0x10:
    pNVar9 = (Node *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
    if (pNVar9 != (Node *)0x0) {
      pSVar4 = this->stream;
      pNVar9->_vptr_Node = (_func_int **)&PTR_anchor_01099770;
      pNVar9->Doc = &pSVar4->CurrentDoc;
      (pNVar9->SourceRange).Start.Ptr = (char *)0x0;
      (pNVar9->SourceRange).End.Ptr = (char *)0x0;
      pNVar9->TypeID = 4;
      (pNVar9->Anchor).Data =
           (char *)((ulong)(AnchorInfo.Range.Data != (char *)0x0) + AnchorInfo._0_8_);
      (pNVar9->Anchor).Length =
           (long)AnchorInfo.Range.Data - (ulong)(AnchorInfo.Range.Data != (char *)0x0);
      (pNVar9->Tag).Data = (char *)TagInfo._0_8_;
      (pNVar9->Tag).Length = (size_t)TagInfo.Range.Data;
      pTVar7 = Scanner::peekNext(*(Scanner **)
                                  ((pSVar4->CurrentDoc)._M_t.
                                   super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                   .super__Head_base<0UL,_llvm::yaml::Document_*,_false>.
                                  _M_head_impl)->stream);
      pcVar5 = (pTVar7->Range).Data;
      (pNVar9->SourceRange).Start.Ptr = pcVar5;
      (pNVar9->SourceRange).End.Ptr = pcVar5;
      pNVar9->_vptr_Node = (_func_int **)&PTR_anchor_01099810;
      *(undefined4 *)&pNVar9[1]._vptr_Node = 2;
LAB_00dc1161:
      *(undefined2 *)((long)&pNVar9[1]._vptr_Node + 4) = 1;
      goto LAB_00dc1243;
    }
    goto switchD_00dc0a28_caseD_0;
  case 0x12:
    Scanner::getNext(&local_190,
                     (Scanner *)
                     (this->stream->scanner)._M_t.
                     super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                     .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190.Value._M_dataplus._M_p != &local_190.Value.field_2) {
      operator_delete(local_190.Value._M_dataplus._M_p,
                      local_190.Value.field_2._M_allocated_capacity + 1);
    }
    pNVar9 = (Node *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
    pcVar5 = T.Range.Data;
    uVar6 = T._0_8_;
    if (pNVar9 != (Node *)0x0) {
      pSVar4 = this->stream;
      pNVar9->_vptr_Node = (_func_int **)&PTR_anchor_01099770;
      pNVar9->Doc = &pSVar4->CurrentDoc;
      (pNVar9->SourceRange).Start.Ptr = (char *)0x0;
      (pNVar9->SourceRange).End.Ptr = (char *)0x0;
      pNVar9->TypeID = 1;
      (pNVar9->Anchor).Data =
           (char *)((ulong)(AnchorInfo.Range.Data != (char *)0x0) + AnchorInfo._0_8_);
      (pNVar9->Anchor).Length =
           (long)AnchorInfo.Range.Data - (ulong)(AnchorInfo.Range.Data != (char *)0x0);
      (pNVar9->Tag).Data = (char *)TagInfo._0_8_;
      (pNVar9->Tag).Length = (size_t)TagInfo.Range.Data;
      Scanner::peekNext(*(Scanner **)
                         ((pSVar4->CurrentDoc)._M_t.
                          super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                          .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                         stream);
      pNVar9->_vptr_Node = (_func_int **)&PTR_anchor_010997b0;
      pNVar9[1]._vptr_Node = (_func_int **)uVar6;
      pNVar9[1].Doc =
           (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)pcVar5;
      (pNVar9->SourceRange).Start.Ptr = (char *)uVar6;
      (pNVar9->SourceRange).End.Ptr = pcVar5 + uVar6;
      goto LAB_00dc13f6;
    }
    goto switchD_00dc0a28_caseD_0;
  case 0x13:
    Scanner::getNext(&local_158,
                     (Scanner *)
                     (this->stream->scanner)._M_t.
                     super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                     .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158.Value._M_dataplus._M_p != &local_158.Value.field_2) {
      operator_delete(local_158.Value._M_dataplus._M_p,
                      local_158.Value.field_2._M_allocated_capacity + 1);
    }
    __src = T.Range.Length;
    __dest = (_func_int **)0x0;
    puVar11 = (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)
              (T.Value._M_dataplus._M_p + 1);
    puVar8 = (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)0x0;
    if (puVar11 !=
        (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)0x0) {
      __dest = (_func_int **)
               BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                         (&this->NodeAllocator,(size_t)puVar11,(Align)0x0);
      memmove(__dest,(void *)__src,(size_t)puVar11);
      puVar8 = puVar11;
    }
    if (puVar8 == (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)
                  0x0) {
      __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/StringRef.h"
                    ,0x289,"StringRef llvm::StringRef::drop_back(size_t) const");
    }
    puVar11 = (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)
              ((long)&puVar8[-1]._M_t.
                      super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                      .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl + 7);
    if (puVar8 < puVar11) {
      puVar11 = puVar8;
    }
    pNVar9 = (Node *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
    pcVar5 = T.Range.Data;
    uVar6 = T._0_8_;
    if (pNVar9 != (Node *)0x0) {
      pSVar4 = this->stream;
      pNVar9->_vptr_Node = (_func_int **)&PTR_anchor_01099770;
      pNVar9->Doc = &pSVar4->CurrentDoc;
      (pNVar9->SourceRange).Start.Ptr = (char *)0x0;
      (pNVar9->SourceRange).End.Ptr = (char *)0x0;
      pNVar9->TypeID = 2;
      (pNVar9->Anchor).Data =
           (char *)((ulong)(AnchorInfo.Range.Data != (char *)0x0) + AnchorInfo._0_8_);
      (pNVar9->Anchor).Length =
           (long)AnchorInfo.Range.Data - (ulong)(AnchorInfo.Range.Data != (char *)0x0);
      (pNVar9->Tag).Data = (char *)TagInfo._0_8_;
      (pNVar9->Tag).Length = (size_t)TagInfo.Range.Data;
      Scanner::peekNext(*(Scanner **)
                         ((pSVar4->CurrentDoc)._M_t.
                          super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                          .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                         stream);
      pNVar9->_vptr_Node = (_func_int **)&PTR_anchor_010997d0;
      pNVar9[1]._vptr_Node = __dest;
      pNVar9[1].Doc = puVar11;
      (pNVar9->SourceRange).Start.Ptr = (char *)uVar6;
      (pNVar9->SourceRange).End.Ptr = pcVar5 + uVar6;
      goto LAB_00dc13f6;
    }
    goto switchD_00dc0a28_caseD_0;
  case 0x14:
    Scanner::getNext(&local_2a8,
                     (Scanner *)
                     (this->stream->scanner)._M_t.
                     super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                     .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8.Value._M_dataplus._M_p != &local_2a8.Value.field_2) {
      operator_delete(local_2a8.Value._M_dataplus._M_p,
                      local_2a8.Value.field_2._M_allocated_capacity + 1);
    }
    pNVar9 = (Node *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
    pcVar5 = T.Range.Data;
    uVar6 = T._0_8_;
    if (pNVar9 != (Node *)0x0) {
      pSVar4 = this->stream;
      pNVar9->_vptr_Node = (_func_int **)&PTR_anchor_01099770;
      pNVar9->Doc = &pSVar4->CurrentDoc;
      (pNVar9->SourceRange).Start.Ptr = (char *)0x0;
      (pNVar9->SourceRange).End.Ptr = (char *)0x0;
      pNVar9->TypeID = 6;
      (pNVar9->Anchor).Data = (char *)0x0;
      (pNVar9->Anchor).Length = 0;
      (pNVar9->Tag).Data = (char *)0x0;
      (pNVar9->Tag).Length = 0;
      pTVar7 = Scanner::peekNext(*(Scanner **)
                                  ((pSVar4->CurrentDoc)._M_t.
                                   super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                   .super__Head_base<0UL,_llvm::yaml::Document_*,_false>.
                                  _M_head_impl)->stream);
      uVar10 = (ulong)(pcVar5 != (char *)0x0);
      pcVar3 = (pTVar7->Range).Data;
      (pNVar9->SourceRange).Start.Ptr = pcVar3;
      (pNVar9->SourceRange).End.Ptr = pcVar3;
      pNVar9->_vptr_Node = (_func_int **)&PTR_anchor_01099850;
      pNVar9[1]._vptr_Node = (_func_int **)(uVar6 + uVar10);
      pNVar9[1].Doc =
           (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)
           (pcVar5 + -uVar10);
      goto LAB_00dc13f6;
    }
    goto switchD_00dc0a28_caseD_0;
  case 0x15:
    if (CStack_68._0_4_ != 0x15) {
      Scanner::getNext((Token *)&local_120,
                       (Scanner *)
                       (this->stream->scanner)._M_t.
                       super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                       .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
      AnchorInfo.Range.Data = (char *)auStack_118._8_8_;
      CStack_68 = local_120;
      AnchorInfo._0_8_ = auStack_118._0_8_;
      pTVar7 = &AnchorInfo;
      goto LAB_00dc0a9c;
    }
    Twine::Twine((Twine *)&local_120,"Already encountered an anchor for this node!");
    Scanner::setError((Scanner *)
                      (this->stream->scanner)._M_t.
                      super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                      .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>,(Twine *)&local_120,
                      (iterator)T._0_8_);
    goto switchD_00dc0a28_caseD_0;
  case 0x16:
    if (CStack_e8._0_4_ == 0x16) {
      Twine::Twine((Twine *)&local_120,"Already encountered a tag for this node!");
      Scanner::setError((Scanner *)
                        (this->stream->scanner)._M_t.
                        super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                        .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>,(Twine *)&local_120,
                        (iterator)T._0_8_);
      goto switchD_00dc0a28_caseD_0;
    }
    Scanner::getNext((Token *)&local_120,
                     (Scanner *)
                     (this->stream->scanner)._M_t.
                     super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                     .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
    TagInfo.Range.Data = (char *)auStack_118._8_8_;
    CStack_e8 = local_120;
    TagInfo._0_8_ = auStack_118._0_8_;
    pTVar7 = &TagInfo;
LAB_00dc0a9c:
    std::__cxx11::string::operator=((string *)&(pTVar7->Range).Length,(string *)&local_108);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8._M_allocated_capacity + 1);
    }
    pTVar7 = Scanner::peekNext((Scanner *)
                               (this->stream->scanner)._M_t.
                               super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                               .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
    T.Range.Data = (char *)(pTVar7->Range).Length;
    uStack_a8 = *(ulong *)pTVar7;
    T._0_8_ = (pTVar7->Range).Data;
    std::__cxx11::string::_M_assign((string *)psVar1);
    goto LAB_00dc0a11;
  }
  *(undefined2 *)((long)&pNVar9[1]._vptr_Node + 4) = 1;
  *(undefined1 *)((long)&pNVar9[1]._vptr_Node + 6) = 1;
LAB_00dc1243:
  pNVar9[1].Doc =
       (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)0x0;
  goto LAB_00dc13f6;
switchD_00dc0a28_caseD_0:
  pNVar9 = (Node *)0x0;
LAB_00dc13f6:
  if ((size_type *)TagInfo.Range.Length != &TagInfo.Value._M_string_length) {
    operator_delete((void *)TagInfo.Range.Length,
                    CONCAT71(TagInfo.Value._M_string_length._1_7_,
                             (undefined1)TagInfo.Value._M_string_length) + 1);
  }
  if ((size_type *)AnchorInfo.Range.Length != &AnchorInfo.Value._M_string_length) {
    operator_delete((void *)AnchorInfo.Range.Length,
                    CONCAT71(AnchorInfo.Value._M_string_length._1_7_,
                             (undefined1)AnchorInfo.Value._M_string_length) + 1);
  }
  if ((size_type *)T.Range.Length != &T.Value._M_string_length) {
    operator_delete((void *)T.Range.Length,T.Value._M_string_length + 1);
  }
  return pNVar9;
}

Assistant:

Node *Document::parseBlockNode() {
  Token T = peekNext();
  // Handle properties.
  Token AnchorInfo;
  Token TagInfo;
parse_property:
  switch (T.Kind) {
  case Token::TK_Alias:
    getNext();
    return new (NodeAllocator) AliasNode(stream.CurrentDoc, T.Range.substr(1));
  case Token::TK_Anchor:
    if (AnchorInfo.Kind == Token::TK_Anchor) {
      setError("Already encountered an anchor for this node!", T);
      return nullptr;
    }
    AnchorInfo = getNext(); // Consume TK_Anchor.
    T = peekNext();
    goto parse_property;
  case Token::TK_Tag:
    if (TagInfo.Kind == Token::TK_Tag) {
      setError("Already encountered a tag for this node!", T);
      return nullptr;
    }
    TagInfo = getNext(); // Consume TK_Tag.
    T = peekNext();
    goto parse_property;
  default:
    break;
  }

  switch (T.Kind) {
  case Token::TK_BlockEntry:
    // We got an unindented BlockEntry sequence. This is not terminated with
    // a BlockEnd.
    // Don't eat the TK_BlockEntry, SequenceNode needs it.
    return new (NodeAllocator) SequenceNode( stream.CurrentDoc
                                           , AnchorInfo.Range.substr(1)
                                           , TagInfo.Range
                                           , SequenceNode::ST_Indentless);
  case Token::TK_BlockSequenceStart:
    getNext();
    return new (NodeAllocator)
      SequenceNode( stream.CurrentDoc
                  , AnchorInfo.Range.substr(1)
                  , TagInfo.Range
                  , SequenceNode::ST_Block);
  case Token::TK_BlockMappingStart:
    getNext();
    return new (NodeAllocator)
      MappingNode( stream.CurrentDoc
                 , AnchorInfo.Range.substr(1)
                 , TagInfo.Range
                 , MappingNode::MT_Block);
  case Token::TK_FlowSequenceStart:
    getNext();
    return new (NodeAllocator)
      SequenceNode( stream.CurrentDoc
                  , AnchorInfo.Range.substr(1)
                  , TagInfo.Range
                  , SequenceNode::ST_Flow);
  case Token::TK_FlowMappingStart:
    getNext();
    return new (NodeAllocator)
      MappingNode( stream.CurrentDoc
                 , AnchorInfo.Range.substr(1)
                 , TagInfo.Range
                 , MappingNode::MT_Flow);
  case Token::TK_Scalar:
    getNext();
    return new (NodeAllocator)
      ScalarNode( stream.CurrentDoc
                , AnchorInfo.Range.substr(1)
                , TagInfo.Range
                , T.Range);
  case Token::TK_BlockScalar: {
    getNext();
    StringRef NullTerminatedStr(T.Value.c_str(), T.Value.length() + 1);
    StringRef StrCopy = NullTerminatedStr.copy(NodeAllocator).drop_back();
    return new (NodeAllocator)
        BlockScalarNode(stream.CurrentDoc, AnchorInfo.Range.substr(1),
                        TagInfo.Range, StrCopy, T.Range);
  }
  case Token::TK_Key:
    // Don't eat the TK_Key, KeyValueNode expects it.
    return new (NodeAllocator)
      MappingNode( stream.CurrentDoc
                 , AnchorInfo.Range.substr(1)
                 , TagInfo.Range
                 , MappingNode::MT_Inline);
  case Token::TK_DocumentStart:
  case Token::TK_DocumentEnd:
  case Token::TK_StreamEnd:
  default:
    // TODO: Properly handle tags. "[!!str ]" should resolve to !!str "", not
    //       !!null null.
    return new (NodeAllocator) NullNode(stream.CurrentDoc);
  case Token::TK_FlowMappingEnd:
  case Token::TK_FlowSequenceEnd:
  case Token::TK_FlowEntry: {
    if (Root && (isa<MappingNode>(Root) || isa<SequenceNode>(Root)))
      return new (NodeAllocator) NullNode(stream.CurrentDoc);

    setError("Unexpected token", T);
    return nullptr;
  }
  case Token::TK_Error:
    return nullptr;
  }
  llvm_unreachable("Control flow shouldn't reach here.");
  return nullptr;
}